

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O0

void eltcalc::GetEventRates(FILE *fin)

{
  mapped_type mVar1;
  int iVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  uint local_1028;
  int ret;
  int lineno;
  EventRates row;
  char line [4096];
  FILE *fin_local;
  
  fgets((char *)&row.event_rate,0x1000,(FILE *)fin);
  local_1028 = 2;
  while( true ) {
    pcVar3 = fgets((char *)&row.event_rate,0x1000,(FILE *)fin);
    if (pcVar3 == (char *)0x0) {
      fclose((FILE *)fin);
      return;
    }
    iVar2 = __isoc99_sscanf(&row.event_rate,"%d,%lf",&ret,&lineno);
    mVar1 = _lineno;
    if (iVar2 != 2) break;
    pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)event_rate_,&ret);
    *pmVar4 = mVar1;
    local_1028 = local_1028 + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)local_1028,&row.event_rate);
  exit(1);
}

Assistant:

void GetEventRates(FILE * fin)
	{
		// Extract event rates from event rates file
		char line[4096];
		EventRates row;
		fgets(line, sizeof(line), fin);   // Read header
		int lineno = 2;
		while (fgets(line, sizeof(line), fin) != 0) {
			int ret = sscanf(line, "%d,%lf", &row.event_id,
					 &row.event_rate);
			if (ret == 2) {
				event_rate_[row.event_id] = row.event_rate;
			} else {
				fprintf(stderr, "FATAL: Invalid data in line %d:\n%s",
					lineno, line);
				exit(EXIT_FAILURE);
			}
			lineno++;
		}
		fclose(fin);
	}